

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_dual_layers(Omega_h *this,Mesh *mesh,Read<signed_char> *marks,Int nlayers)

{
  Write<signed_char> *this_00;
  Omega_h_Parting OVar1;
  uint uVar2;
  void *extraout_RDX;
  Int IVar3;
  bool bVar4;
  Read<signed_char> RVar5;
  Write<signed_char> local_a0;
  undefined1 local_90 [64];
  Graph dual;
  
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    Mesh::ask_dual(&dual,mesh);
    IVar3 = 0;
    if (0 < nlayers) {
      IVar3 = nlayers;
    }
    this_00 = (Write<signed_char> *)(local_90 + 0x10);
    while (bVar4 = IVar3 != 0, IVar3 = IVar3 + -1, bVar4) {
      Graph::Graph((Graph *)(local_90 + 0x20),&dual);
      Write<signed_char>::Write(&local_a0,&marks->write_);
      graph_reduce<signed_char>
                ((Omega_h *)local_90,(Graph *)(local_90 + 0x20),(Read<signed_char> *)&local_a0,1,
                 OMEGA_H_MAX);
      Write<signed_char>::operator=(&marks->write_,(Write<signed_char> *)local_90);
      Write<signed_char>::~Write((Write<signed_char> *)local_90);
      Write<signed_char>::~Write(&local_a0);
      Graph::~Graph((Graph *)(local_90 + 0x20));
      uVar2 = Mesh::dim(mesh);
      Write<signed_char>::Write(this_00,&marks->write_);
      Mesh::sync_array<signed_char>
                ((Mesh *)local_90,(Int)mesh,(Read<signed_char> *)(ulong)uVar2,(Int)this_00);
      Write<signed_char>::operator=(&marks->write_,(Write<signed_char> *)local_90);
      Write<signed_char>::~Write((Write<signed_char> *)local_90);
      Write<signed_char>::~Write(this_00);
    }
    Write<signed_char>::Write((Write<signed_char> *)this,&marks->write_);
    Graph::~Graph(&dual);
    RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xbf);
}

Assistant:

Read<I8> mark_dual_layers(Mesh* mesh, Read<I8> marks, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto dual = mesh->ask_dual();
  for (Int i = 0; i < nlayers; ++i) {
    marks = graph_reduce(dual, marks, 1, OMEGA_H_MAX);
    marks = mesh->sync_array(mesh->dim(), marks, 1);
  }
  return marks;
}